

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

bool __thiscall
FWeaponSlots::LocateWeapon(FWeaponSlots *this,PClassWeapon *type,int *slot,int *index)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  WeaponInfo *pWVar6;
  
  bVar1 = true;
  uVar3 = 0;
  do {
    uVar5 = (ulong)this->Slots[uVar3].Weapons.Count;
    iVar4 = -1;
    if (uVar5 != 0) {
      pWVar6 = this->Slots[uVar3].Weapons.Array;
      uVar2 = 0;
      do {
        if (pWVar6->Type == type) {
          iVar4 = (int)uVar2;
          break;
        }
        uVar2 = uVar2 + 1;
        pWVar6 = pWVar6 + 1;
      } while (uVar5 != uVar2);
    }
    if (-1 < iVar4) {
      if (slot != (int *)0x0) {
        *slot = (int)uVar3;
      }
      if (index == (int *)0x0) {
        return bVar1;
      }
      *index = iVar4;
      return bVar1;
    }
    bVar1 = uVar3 < 9;
    uVar3 = uVar3 + 1;
    if (uVar3 == 10) {
      return bVar1;
    }
  } while( true );
}

Assistant:

bool FWeaponSlots::LocateWeapon (PClassWeapon *type, int *const slot, int *const index)
{
	int i, j;

	for (i = 0; i < NUM_WEAPON_SLOTS; i++)
	{
		j = Slots[i].LocateWeapon(type);
		if (j >= 0)
		{
			if (slot != NULL) *slot = i;
			if (index != NULL) *index = j;
			return true;
		}
	}
	return false;
}